

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-ft-raster.c
# Opt level: O1

void gray_render_cubic(PWorker worker,PVG_FT_Vector *control1,PVG_FT_Vector *control2,
                      PVG_FT_Vector *to)

{
  ulong uVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  PVG_FT_Vector bez_stack [49];
  long local_338 [6];
  TPos local_308;
  long local_300 [91];
  
  local_338[0] = to->x << 2;
  local_338[1] = to->y * 4;
  local_338[2] = control2->x << 2;
  local_338[3] = control2->y * 4;
  local_338[4] = control1->x << 2;
  local_338[5] = control1->y * 4;
  local_308 = worker->x;
  local_300[0] = worker->y;
  lVar4 = to->y >> 6;
  lVar15 = worker->max_ey;
  lVar2 = control2->y >> 6;
  lVar3 = control1->y >> 6;
  lVar7 = worker->y >> 8;
  if (((lVar15 <= lVar2 && lVar15 <= lVar4) && (lVar15 <= lVar7 && lVar15 <= lVar3)) ||
     (lVar15 = worker->min_ey,
     (lVar3 < lVar15 && (lVar2 < lVar15 && lVar4 < lVar15)) && lVar7 < lVar15)) {
    worker->x = local_338[0];
    worker->y = local_338[1];
    return;
  }
  lVar15 = 0;
  do {
    while( true ) {
      lVar2 = *(long *)((long)local_338 + lVar15);
      lVar4 = *(long *)((long)local_338 + lVar15 + 8);
      uVar1 = *(long *)((long)&local_308 + lVar15) - lVar2;
      lVar3 = *(long *)((long)local_300 + lVar15);
      uVar5 = lVar3 - lVar4;
      uVar10 = -uVar1;
      if (0 < (long)uVar1) {
        uVar10 = uVar1;
      }
      uVar6 = -uVar5;
      if (0 < (long)uVar5) {
        uVar6 = uVar5;
      }
      if (uVar6 < uVar10) {
        uVar6 = uVar6 * 3 >> 3;
      }
      else {
        uVar10 = uVar10 * 3 >> 3;
      }
      lVar7 = uVar6 + uVar10;
      if (lVar7 < 0x800000) break;
LAB_0013c4f8:
      if (lVar15 == 0x2d0) {
        return;
      }
      lVar7 = *(long *)((long)&local_308 + lVar15);
      *(long *)((long)local_300 + lVar15 + 0x28) = lVar7;
      lVar9 = *(long *)((long)local_338 + lVar15 + 0x20);
      lVar8 = *(long *)((long)local_338 + lVar15 + 0x10);
      lVar11 = *(long *)((long)local_338 + lVar15 + 0x18);
      lVar12 = (lVar2 + lVar8) / 2;
      *(long *)((long)local_338 + lVar15 + 0x10) = lVar12;
      lVar2 = (lVar7 + lVar9) / 2;
      *(long *)((long)local_300 + lVar15 + 0x18) = lVar2;
      lVar7 = (lVar9 + lVar8) / 2;
      lVar9 = (lVar12 + lVar7) / 2;
      *(long *)((long)local_338 + lVar15 + 0x20) = lVar9;
      lVar2 = (lVar7 + lVar2) / 2;
      *(long *)((long)local_300 + lVar15 + 8) = lVar2;
      *(long *)((long)&local_308 + lVar15) = (lVar2 + lVar9) / 2;
      *(long *)((long)local_300 + lVar15 + 0x30) = lVar3;
      lVar2 = *(long *)((long)local_338 + lVar15 + 0x28);
      lVar4 = (lVar4 + lVar11) / 2;
      *(long *)((long)local_338 + lVar15 + 0x18) = lVar4;
      lVar3 = (lVar3 + lVar2) / 2;
      *(long *)((long)local_300 + lVar15 + 0x20) = lVar3;
      lVar2 = (lVar2 + lVar11) / 2;
      lVar4 = (lVar4 + lVar2) / 2;
      *(long *)((long)local_338 + lVar15 + 0x28) = lVar4;
      lVar2 = (lVar2 + lVar3) / 2;
      *(long *)((long)local_300 + lVar15 + 0x10) = lVar2;
      *(long *)((long)local_300 + lVar15) = (lVar2 + lVar4) / 2;
      lVar15 = lVar15 + 0x30;
    }
    lVar13 = lVar7 * 0x2a;
    lVar11 = *(long *)((long)local_338 + lVar15 + 0x10) - lVar2;
    lVar8 = *(long *)((long)local_338 + lVar15 + 0x18) - lVar4;
    lVar12 = lVar11 * uVar5 - lVar8 * uVar1;
    lVar9 = -lVar12;
    if (0 < lVar12) {
      lVar9 = lVar12;
    }
    if (lVar9 != lVar13 && SBORROW8(lVar9,lVar13) == lVar9 + lVar7 * -0x2a < 0) goto LAB_0013c4f8;
    lVar16 = *(long *)((long)local_338 + lVar15 + 0x20) - lVar2;
    lVar12 = *(long *)((long)local_338 + lVar15 + 0x28) - lVar4;
    lVar14 = lVar16 * uVar5 - lVar12 * uVar1;
    lVar9 = -lVar14;
    if (0 < lVar14) {
      lVar9 = lVar14;
    }
    if (((lVar9 != lVar13 && SBORROW8(lVar9,lVar13) == lVar9 + lVar7 * -0x2a < 0) ||
        (lVar11 = (lVar11 - uVar1) * lVar11, lVar8 = (lVar8 - uVar5) * lVar8, lVar7 = lVar8 + lVar11
        , lVar7 != 0 && SCARRY8(lVar8,lVar11) == lVar7 < 0)) ||
       (lVar16 = (lVar16 - uVar1) * lVar16, lVar12 = (lVar12 - uVar5) * lVar12,
       lVar7 = lVar12 + lVar16, lVar7 != 0 && SCARRY8(lVar12,lVar16) == lVar7 < 0))
    goto LAB_0013c4f8;
    gray_render_line(worker,lVar2,lVar4);
    if (lVar15 == 0) {
      return;
    }
    lVar15 = lVar15 + -0x30;
  } while( true );
}

Assistant:

static void
  gray_render_cubic( RAS_ARG_ const PVG_FT_Vector*  control1,
                              const PVG_FT_Vector*  control2,
                              const PVG_FT_Vector*  to )
  {
    PVG_FT_Vector   bez_stack[16 * 3 + 1];  /* enough to accommodate bisections */
    PVG_FT_Vector*  arc = bez_stack;
    PVG_FT_Vector*  limit = bez_stack + 45;
    TPos        dx, dy, dx_, dy_;
    TPos        dx1, dy1, dx2, dy2;
    TPos        L, s, s_limit;


    arc[0].x = UPSCALE( to->x );
    arc[0].y = UPSCALE( to->y );
    arc[1].x = UPSCALE( control2->x );
    arc[1].y = UPSCALE( control2->y );
    arc[2].x = UPSCALE( control1->x );
    arc[2].y = UPSCALE( control1->y );
    arc[3].x = ras.x;
    arc[3].y = ras.y;

    /* short-cut the arc that crosses the current band */
    if ( ( TRUNC( arc[0].y ) >= ras.max_ey &&
           TRUNC( arc[1].y ) >= ras.max_ey &&
           TRUNC( arc[2].y ) >= ras.max_ey &&
           TRUNC( arc[3].y ) >= ras.max_ey ) ||
         ( TRUNC( arc[0].y ) <  ras.min_ey &&
           TRUNC( arc[1].y ) <  ras.min_ey &&
           TRUNC( arc[2].y ) <  ras.min_ey &&
           TRUNC( arc[3].y ) <  ras.min_ey ) )
    {
      ras.x = arc[0].x;
      ras.y = arc[0].y;
      return;
    }

    for (;;)
    {
      /* Decide whether to split or draw. See `Rapid Termination          */
      /* Evaluation for Recursive Subdivision of Bezier Curves' by Thomas */
      /* F. Hain, at                                                      */
      /* http://www.cis.southalabama.edu/~hain/general/Publications/Bezier/Camera-ready%20CISST02%202.pdf */


      /* dx and dy are x and y components of the P0-P3 chord vector. */
      dx = dx_ = arc[3].x - arc[0].x;
      dy = dy_ = arc[3].y - arc[0].y;

      L = PVG_FT_HYPOT( dx_, dy_ );

      /* Avoid possible arithmetic overflow below by splitting. */
      if ( L >= (1 << 23) )
        goto Split;

      /* Max deviation may be as much as (s/L) * 3/4 (if Hain's v = 1). */
      s_limit = L * (TPos)( ONE_PIXEL / 6 );

      /* s is L * the perpendicular distance from P1 to the line P0-P3. */
      dx1 = arc[1].x - arc[0].x;
      dy1 = arc[1].y - arc[0].y;
      s = PVG_FT_ABS( dy * dx1 - dx * dy1 );

      if ( s > s_limit )
        goto Split;

      /* s is L * the perpendicular distance from P2 to the line P0-P3. */
      dx2 = arc[2].x - arc[0].x;
      dy2 = arc[2].y - arc[0].y;
      s = PVG_FT_ABS( dy * dx2 - dx * dy2 );

      if ( s > s_limit )
        goto Split;

      /* Split super curvy segments where the off points are so far
         from the chord that the angles P0-P1-P3 or P0-P2-P3 become
         acute as detected by appropriate dot products. */
      if ( dx1 * ( dx1 - dx ) + dy1 * ( dy1 - dy ) > 0 ||
           dx2 * ( dx2 - dx ) + dy2 * ( dy2 - dy ) > 0 )
        goto Split;

      gray_render_line( RAS_VAR_ arc[0].x, arc[0].y );

      if ( arc == bez_stack )
        return;

      arc -= 3;
      continue;

    Split:
      if( arc == limit )
        return;
      gray_split_cubic( arc );
      arc += 3;
    }
  }